

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gluTextureTestUtil.cpp
# Opt level: O0

bool glu::TextureTestUtil::verifyTextureResult
               (TestContext *testCtx,ConstPixelBufferAccess *result,Texture1DArrayView *src,
               float *texCoord,ReferenceParams *sampleParams,LookupPrecision *lookupPrec,
               LodPrecision *lodPrec,PixelFormat *pixelFormat)

{
  int iVar1;
  int iVar2;
  TestLog *this;
  qpWatchDog *watchDog;
  MessageBuilder *pMVar3;
  TestLog *pTVar4;
  bool bVar5;
  allocator<char> local_599;
  string local_598;
  allocator<char> local_571;
  string local_570;
  LogImage local_550;
  allocator<char> local_4b9;
  string local_4b8;
  allocator<char> local_491;
  string local_490;
  LogImage local_470;
  allocator<char> local_3d9;
  string local_3d8;
  allocator<char> local_3b1;
  string local_3b0;
  LogImage local_390;
  allocator<char> local_2f9;
  string local_2f8;
  allocator<char> local_2d1;
  string local_2d0;
  LogImageSet local_2b0;
  MessageBuilder local_270;
  PixelBufferAccess local_f0;
  ConstPixelBufferAccess local_c8;
  SurfaceAccess local_a0;
  int local_80 [2];
  int numFailedPixels;
  undefined1 local_70 [8];
  Surface errorMask;
  Surface reference;
  TestLog *log;
  LookupPrecision *lookupPrec_local;
  ReferenceParams *sampleParams_local;
  float *texCoord_local;
  Texture1DArrayView *src_local;
  ConstPixelBufferAccess *result_local;
  TestContext *testCtx_local;
  
  this = tcu::TestContext::getLog(testCtx);
  iVar1 = tcu::ConstPixelBufferAccess::getWidth(result);
  iVar2 = tcu::ConstPixelBufferAccess::getHeight(result);
  tcu::Surface::Surface((Surface *)&errorMask.m_pixels.m_cap,iVar1,iVar2);
  iVar1 = tcu::ConstPixelBufferAccess::getWidth(result);
  iVar2 = tcu::ConstPixelBufferAccess::getHeight(result);
  tcu::Surface::Surface((Surface *)local_70,iVar1,iVar2);
  tcu::SurfaceAccess::SurfaceAccess(&local_a0,(Surface *)&errorMask.m_pixels.m_cap,pixelFormat);
  sampleTexture(&local_a0,src,texCoord,sampleParams);
  tcu::Surface::getAccess((PixelBufferAccess *)&local_c8,(Surface *)&errorMask.m_pixels.m_cap);
  tcu::Surface::getAccess(&local_f0,(Surface *)local_70);
  watchDog = tcu::TestContext::getWatchDog(testCtx);
  local_80[0] = computeTextureLookupDiff
                          (result,&local_c8,&local_f0,src,texCoord,sampleParams,lookupPrec,lodPrec,
                           watchDog);
  if (0 < local_80[0]) {
    tcu::TestLog::operator<<(&local_270,this,(BeginMessageToken *)&tcu::TestLog::Message);
    pMVar3 = tcu::MessageBuilder::operator<<
                       (&local_270,(char (*) [40])"ERROR: Result verification failed, got ");
    pMVar3 = tcu::MessageBuilder::operator<<(pMVar3,local_80);
    pMVar3 = tcu::MessageBuilder::operator<<(pMVar3,(char (*) [17])" invalid pixels!");
    tcu::MessageBuilder::operator<<(pMVar3,(EndMessageToken *)&tcu::TestLog::EndMessage);
    tcu::MessageBuilder::~MessageBuilder(&local_270);
  }
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_2d0,"VerifyResult",&local_2d1)
  ;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_2f8,"Verification result",&local_2f9);
  tcu::LogImageSet::LogImageSet(&local_2b0,&local_2d0,&local_2f8);
  pTVar4 = tcu::TestLog::operator<<(this,&local_2b0);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_3b0,"Rendered",&local_3b1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_3d8,"Rendered image",&local_3d9);
  tcu::LogImage::LogImage(&local_390,&local_3b0,&local_3d8,result,QP_IMAGE_COMPRESSION_MODE_BEST);
  tcu::TestLog::operator<<(pTVar4,&local_390);
  tcu::LogImage::~LogImage(&local_390);
  std::__cxx11::string::~string((string *)&local_3d8);
  std::allocator<char>::~allocator(&local_3d9);
  std::__cxx11::string::~string((string *)&local_3b0);
  std::allocator<char>::~allocator(&local_3b1);
  tcu::LogImageSet::~LogImageSet(&local_2b0);
  std::__cxx11::string::~string((string *)&local_2f8);
  std::allocator<char>::~allocator(&local_2f9);
  std::__cxx11::string::~string((string *)&local_2d0);
  std::allocator<char>::~allocator(&local_2d1);
  if (0 < local_80[0]) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_490,"Reference",&local_491);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_4b8,"Ideal reference image",&local_4b9);
    tcu::LogImage::LogImage
              (&local_470,&local_490,&local_4b8,(Surface *)&errorMask.m_pixels.m_cap,
               QP_IMAGE_COMPRESSION_MODE_BEST);
    pTVar4 = tcu::TestLog::operator<<(this,&local_470);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_570,"ErrorMask",&local_571);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_598,"Error mask",&local_599)
    ;
    tcu::LogImage::LogImage
              (&local_550,&local_570,&local_598,(Surface *)local_70,QP_IMAGE_COMPRESSION_MODE_BEST);
    tcu::TestLog::operator<<(pTVar4,&local_550);
    tcu::LogImage::~LogImage(&local_550);
    std::__cxx11::string::~string((string *)&local_598);
    std::allocator<char>::~allocator(&local_599);
    std::__cxx11::string::~string((string *)&local_570);
    std::allocator<char>::~allocator(&local_571);
    tcu::LogImage::~LogImage(&local_470);
    std::__cxx11::string::~string((string *)&local_4b8);
    std::allocator<char>::~allocator(&local_4b9);
    std::__cxx11::string::~string((string *)&local_490);
    std::allocator<char>::~allocator(&local_491);
  }
  tcu::TestLog::operator<<(this,(EndImageSetToken *)&tcu::TestLog::EndImageSet);
  bVar5 = local_80[0] == 0;
  tcu::Surface::~Surface((Surface *)local_70);
  tcu::Surface::~Surface((Surface *)&errorMask.m_pixels.m_cap);
  return bVar5;
}

Assistant:

bool verifyTextureResult (tcu::TestContext&						testCtx,
						  const tcu::ConstPixelBufferAccess&	result,
						  const tcu::Texture1DArrayView&		src,
						  const float*							texCoord,
						  const ReferenceParams&				sampleParams,
						  const tcu::LookupPrecision&			lookupPrec,
						  const tcu::LodPrecision&				lodPrec,
						  const tcu::PixelFormat&				pixelFormat)
{
	tcu::TestLog&	log				= testCtx.getLog();
	tcu::Surface	reference		(result.getWidth(), result.getHeight());
	tcu::Surface	errorMask		(result.getWidth(), result.getHeight());
	int				numFailedPixels;

	DE_ASSERT(getCompareMask(pixelFormat) == lookupPrec.colorMask);

	sampleTexture(tcu::SurfaceAccess(reference, pixelFormat), src, texCoord, sampleParams);
	numFailedPixels = computeTextureLookupDiff(result, reference.getAccess(), errorMask.getAccess(), src, texCoord, sampleParams, lookupPrec, lodPrec, testCtx.getWatchDog());

	if (numFailedPixels > 0)
		log << tcu::TestLog::Message << "ERROR: Result verification failed, got " << numFailedPixels << " invalid pixels!" << tcu::TestLog::EndMessage;

	log << tcu::TestLog::ImageSet("VerifyResult", "Verification result")
		<< tcu::TestLog::Image("Rendered", "Rendered image", result);

	if (numFailedPixels > 0)
	{
		log << tcu::TestLog::Image("Reference", "Ideal reference image", reference)
			<< tcu::TestLog::Image("ErrorMask", "Error mask", errorMask);
	}

	log << tcu::TestLog::EndImageSet;

	return numFailedPixels == 0;
}